

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

void usage(char *program)

{
  ulong uVar1;
  char **ppcVar2;
  
  printf("Usage: %s [options] <test> <test> ...\n",program);
  puts("Default is to run all tests.");
  puts("Otherwise, specify the numbers of the tests you wish to run.");
  puts("Options:");
  puts("  -d  Dump core after any failure, for debugging.");
  puts("  -k  Keep all temp files.");
  puts("      Default: temp files for successful tests deleted.");
  puts("  -p <path>  Path to executable to be tested.");
  puts("      Default: path taken from BSDTAR environment variable.");
  puts("  -q  Quiet.");
  puts("  -r <dir>   Path to dir containing reference files.");
  puts("      Default: Current directory.");
  puts("  -s  Exit with code 2 if any tests were skipped.");
  puts("  -u  Keep running specified tests until one fails.");
  puts("  -v  Verbose.");
  puts("Available tests:");
  ppcVar2 = &tests[0].name;
  for (uVar1 = 0; uVar1 != 0x4a; uVar1 = uVar1 + 1) {
    printf("  %d: %s\n",uVar1 & 0xffffffff,*ppcVar2);
    ppcVar2 = ppcVar2 + 3;
  }
  exit(1);
}

Assistant:

static void
usage(const char *program)
{
	static const int limit = nitems(tests);
	int i;

	printf("Usage: %s [options] <test> <test> ...\n", program);
	printf("Default is to run all tests.\n");
	printf("Otherwise, specify the numbers of the tests you wish to run.\n");
	printf("Options:\n");
	printf("  -d  Dump core after any failure, for debugging.\n");
	printf("  -k  Keep all temp files.\n");
	printf("      Default: temp files for successful tests deleted.\n");
#ifdef PROGRAM
	printf("  -p <path>  Path to executable to be tested.\n");
	printf("      Default: path taken from " ENVBASE " environment variable.\n");
#endif
	printf("  -q  Quiet.\n");
	printf("  -r <dir>   Path to dir containing reference files.\n");
	printf("      Default: Current directory.\n");
	printf("  -s  Exit with code 2 if any tests were skipped.\n");
	printf("  -u  Keep running specified tests until one fails.\n");
	printf("  -v  Verbose.\n");
	printf("Available tests:\n");
	for (i = 0; i < limit; i++)
		printf("  %d: %s\n", i, tests[i].name);
	exit(1);
}